

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O3

int cmExecuteCommand(void *arg,char *name,int numArgs,char **args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ulong uVar3;
  cmExecutionStatus status;
  cmListFileFunction lff;
  allocator local_e9;
  long *local_e8;
  long local_e0;
  long local_d8 [2];
  cmMakefile *local_c8;
  cmListFileArgument local_c0;
  cmListFileFunction local_90;
  
  local_90.super_cmListFileContext.Name._M_dataplus._M_p =
       (pointer)&local_90.super_cmListFileContext.Name.field_2;
  local_90.super_cmListFileContext.Name._M_string_length = 0;
  local_90.super_cmListFileContext.Name.field_2._M_local_buf[0] = '\0';
  local_90.super_cmListFileContext.FilePath._M_dataplus._M_p =
       (pointer)&local_90.super_cmListFileContext.FilePath.field_2;
  local_90.super_cmListFileContext.FilePath._M_string_length = 0;
  local_90.super_cmListFileContext.FilePath.field_2._M_local_buf[0] = '\0';
  local_90.super_cmListFileContext.Line = 0;
  local_90.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8 = (cmMakefile *)arg;
  strlen(name);
  std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,(ulong)name);
  if (0 < numArgs) {
    paVar1 = &local_c0.Value.field_2;
    uVar3 = 0;
    do {
      std::__cxx11::string::string((string *)&local_e8,args[uVar3],&local_e9);
      local_c0.Value._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,local_e8,local_e0 + (long)local_e8);
      local_c0.Delim = Quoted;
      local_c0.Line = 0;
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
      emplace_back<cmListFileArgument>(&local_90.Arguments,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.Value._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0.Value._M_dataplus._M_p,
                        local_c0.Value.field_2._M_allocated_capacity + 1);
      }
      if (local_e8 != local_d8) {
        operator_delete(local_e8,local_d8[0] + 1);
      }
      uVar3 = uVar3 + 1;
    } while ((uint)numArgs != uVar3);
  }
  local_c0.Value._M_dataplus._M_p = local_c0.Value._M_dataplus._M_p & 0xffffffff00000000;
  bVar2 = cmMakefile::ExecuteCommand(local_c8,&local_90,(cmExecutionStatus *)&local_c0);
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_90.Arguments)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.super_cmListFileContext.FilePath._M_dataplus._M_p !=
      &local_90.super_cmListFileContext.FilePath.field_2) {
    operator_delete(local_90.super_cmListFileContext.FilePath._M_dataplus._M_p,
                    CONCAT71(local_90.super_cmListFileContext.FilePath.field_2._M_allocated_capacity
                             ._1_7_,local_90.super_cmListFileContext.FilePath.field_2._M_local_buf
                                    [0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.super_cmListFileContext.Name._M_dataplus._M_p !=
      &local_90.super_cmListFileContext.Name.field_2) {
    operator_delete(local_90.super_cmListFileContext.Name._M_dataplus._M_p,
                    CONCAT71(local_90.super_cmListFileContext.Name.field_2._M_allocated_capacity.
                             _1_7_,local_90.super_cmListFileContext.Name.field_2._M_local_buf[0]) +
                    1);
  }
  return (int)bVar2;
}

Assistant:

int CCONV cmExecuteCommand(void *arg, const char *name,
                     int numArgs, const char **args)
{
  cmMakefile *mf = static_cast<cmMakefile *>(arg);
  cmListFileFunction lff;
  lff.Name = name;
  for(int i = 0; i < numArgs; ++i)
    {
    // Assume all arguments are quoted.
    lff.Arguments.push_back(
      cmListFileArgument(args[i], cmListFileArgument::Quoted, 0));
    }
  cmExecutionStatus status;
  return mf->ExecuteCommand(lff,status);
}